

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cmdline::parser::get<std::__cxx11::string>(parser *this,string *name)

{
  const_iterator cVar1;
  long lVar2;
  cmdline_error *pcVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->options)._M_t._M_impl.super__Rb_tree_header) {
    pcVar3 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_60,"there is no flag: --",name);
    cmdline_error::cmdline_error(pcVar3,&local_60);
    __cxa_throw(pcVar3,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)this,name);
  if (*(long *)(cVar1._M_node + 2) != 0) {
    lVar2 = __dynamic_cast(*(long *)(cVar1._M_node + 2),&option_base::typeinfo,
                           &option_with_value<std::__cxx11::string>::typeinfo,0);
    if (lVar2 != 0) {
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x78);
    }
  }
  pcVar3 = (cmdline_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"type mismatch flag \'",name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar5) {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60.field_2._8_8_ = plVar4[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar5;
  }
  local_60._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cmdline_error::cmdline_error(pcVar3,&local_60);
  __cxa_throw(pcVar3,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
}

Assistant:

const T &get(const std::string &name) const {
    if (options.count(name) == 0)
      throw cmdline_error("there is no flag: --" + name);
    const option_with_value<T> *p =
        dynamic_cast<const option_with_value<T> *>(options.find(name)->second);
    if (p == NULL) throw cmdline_error("type mismatch flag '" + name + "'");
    return p->get();
  }